

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# listener.c
# Opt level: O3

int nni_listener_start(nni_listener *l,int flags)

{
  _Bool _Var1;
  nng_err num;
  uint32_t uVar2;
  char *pcVar3;
  char local_b8 [8];
  char us [144];
  
  _Var1 = nni_atomic_flag_test_and_set(&l->l_started);
  num = NNG_ESTATE;
  if (!_Var1) {
    num = (*(l->l_ops).l_bind)(l->l_data,&l->l_url);
    if (num == NNG_OK) {
      nng_url_sprintf(local_b8,0x90,&l->l_url);
      uVar2 = nni_sock_id(l->l_sock);
      num = NNG_OK;
      nng_log_info("NNG-LISTEN","Starting listener for socket<%u> on %s",(ulong)uVar2,local_b8);
      (*(l->l_ops).l_accept)(l->l_data,&l->l_acc_aio);
    }
    else {
      uVar2 = nni_sock_id(l->l_sock);
      pcVar3 = nng_strerror(num);
      nng_log_warn("NNG-BIND-FAIL","Failed binding socket<%u>: %s",(ulong)uVar2,pcVar3);
      nni_listener_bump_error(l,num);
      nni_atomic_flag_reset(&l->l_started);
    }
  }
  return num;
}

Assistant:

int
nni_listener_start(nni_listener *l, int flags)
{
	int            rv;
	const nng_url *url;
	char           us[NNG_MAXADDRSTRLEN];
	NNI_ARG_UNUSED(flags);

	if (nni_atomic_flag_test_and_set(&l->l_started)) {
		return (NNG_ESTATE);
	}

	if ((rv = l->l_ops.l_bind(l->l_data, &l->l_url)) != 0) {
		nng_log_warn("NNG-BIND-FAIL", "Failed binding socket<%u>: %s",
		    nni_sock_id(l->l_sock), nng_strerror(rv));
		nni_listener_bump_error(l, rv);
		nni_atomic_flag_reset(&l->l_started);
		return (rv);
	}
	// collect the URL which may have changed (e.g. binding to port 0)
	url = nni_listener_url(l);
	nng_url_sprintf(us, sizeof(us), url);
	nng_log_info("NNG-LISTEN", "Starting listener for socket<%u> on %s",
	    nni_sock_id(l->l_sock), us);

	listener_accept_start(l);

	return (0);
}